

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall
glu::TextureBuffer::TextureBuffer
          (TextureBuffer *this,RenderContext *context,deUint32 internalFormat,size_t bufferSize,
          size_t offset,size_t size,void *data)

{
  this->m_context = context;
  this->m_format = 0;
  (this->m_refBuffer).m_ptr = (void *)0x0;
  (this->m_refBuffer).m_cap = 0;
  this->m_offset = 0;
  this->m_size = 0;
  this->m_glTexture = 0;
  this->m_glBuffer = 0;
  init(this,(EVP_PKEY_CTX *)(ulong)internalFormat);
  return;
}

Assistant:

TextureBuffer::TextureBuffer (const RenderContext& context, deUint32 internalFormat, size_t bufferSize, size_t offset, size_t size, const void* data)
	: m_context			(context)
	, m_format			(0)
	, m_offset			(0)
	, m_size			(0)
	, m_glTexture		(0)
	, m_glBuffer		(0)
{
	init(internalFormat, bufferSize, offset, size, data);
}